

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall defyx::JitCompilerX86::generateCode(JitCompilerX86 *this,Instruction *instr,int i)

{
  undefined4 in_EDX;
  byte *in_RSI;
  long in_RDI;
  InstructionGeneratorX86 generator;
  code *local_48;
  value_type_conflict1 *in_stack_ffffffffffffffc8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_48 = *(code **)(engine + (ulong)*in_RSI * 0x10);
  if (((ulong)local_48 & 1) != 0) {
    local_48 = *(code **)(local_48 +
                         *(long *)(in_RDI + *(long *)(engine + (ulong)*in_RSI * 0x10 + 8)) + -1);
  }
  (*local_48)((long *)(in_RDI + *(long *)(engine + (ulong)*in_RSI * 0x10 + 8)),in_RSI,in_EDX);
  return;
}

Assistant:

void JitCompilerX86::generateCode(Instruction& instr, int i) {
		instructionOffsets.push_back(codePos);
		auto generator = engine[instr.opcode];
		(this->*generator)(instr, i);
	}